

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_Plane * __thiscall
ON_SubDMeshFragment::CenterFrame(ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  double *pdVar1;
  size_t sVar2;
  double d;
  bool bVar3;
  uint uVar4;
  undefined1 auStack_150 [4];
  uint P_dex;
  double local_148;
  double local_140;
  ON_3dVector local_138;
  ON_3dVector local_120;
  undefined1 auStack_108 [8];
  ON_3dVector X;
  undefined1 local_d8 [8];
  ON_3dVector V;
  undefined1 local_b0 [8];
  ON_3dPoint Q;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  undefined1 local_48 [8];
  ON_3dVector N;
  ON_3dPoint P;
  ON_SubDMeshFragment *this_local;
  ON_Plane *center_frame;
  
  bVar3 = HasValidPointAndNormalGrid(this);
  if (bVar3) {
    if ((this->m_grid).m_side_segment_count == '\x01') {
      ON_3dPoint::ON_3dPoint
                ((ON_3dPoint *)&N.z,
                 (*this->m_P + this->m_P[this->m_P_stride] + this->m_P[this->m_P_stride * 2] +
                 this->m_P[this->m_P_stride * 3]) * 0.25,
                 (this->m_P[1] + this->m_P[this->m_P_stride + 1] +
                  this->m_P[this->m_P_stride * 2 + 1] + this->m_P[this->m_P_stride * 3 + 1]) * 0.25,
                 (this->m_P[2] + this->m_P[this->m_P_stride + 2] +
                  this->m_P[this->m_P_stride * 2 + 2] + this->m_P[this->m_P_stride * 3 + 2]) * 0.25)
      ;
      ON_3dVector::ON_3dVector
                (&local_60,
                 *this->m_N + this->m_N[this->m_N_stride] + this->m_N[this->m_N_stride * 2] +
                 this->m_N[this->m_N_stride * 3],
                 this->m_N[1] + this->m_N[this->m_N_stride + 1] +
                 this->m_N[this->m_N_stride * 2 + 1] + this->m_N[this->m_N_stride * 3 + 1],
                 this->m_N[2] + this->m_N[this->m_N_stride + 2] +
                 this->m_N[this->m_N_stride * 2 + 2] + this->m_N[this->m_N_stride * 3 + 2]);
      ON_3dVector::UnitVector((ON_3dVector *)local_48,&local_60);
      bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)local_48);
      if (!bVar3) {
        ON_3dVector::ON_3dVector(&local_90,this->m_N);
        ON_3dVector::UnitVector(&local_78,&local_90);
        local_48 = (undefined1  [8])local_78.x;
        N.x = local_78.y;
        N.y = local_78.z;
      }
      bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)local_48);
      if (bVar3) {
        Q.z._7_1_ = 0;
        ON_Plane::ON_Plane(__return_storage_ptr__,(ON_3dPoint *)&N.z,(ON_3dVector *)local_48);
        pdVar1 = this->m_P;
        sVar2 = this->m_P_stride;
        ON_3dPoint::ON_3dPoint
                  ((ON_3dPoint *)local_b0,(pdVar1[sVar2] + pdVar1[sVar2 * 3]) * 0.5,
                   (pdVar1[sVar2 + 1] + pdVar1[sVar2 * 3 + 1]) * 0.5,
                   (pdVar1[sVar2 + 2] + pdVar1[sVar2 * 3 + 2]) * 0.5);
        ON_3dPoint::operator-((ON_3dVector *)&X.z,(ON_3dPoint *)local_b0,(ON_3dPoint *)&N.z);
        ON_3dVector::UnitVector((ON_3dVector *)local_d8,(ON_3dVector *)&X.z);
        d = ON_3dVector::operator*((ON_3dVector *)local_48,(ON_3dVector *)local_d8);
        ::operator*(&local_138,d,(ON_3dVector *)local_d8);
        ON_3dVector::operator-(&local_120,(ON_3dVector *)local_d8,&local_138);
        ON_3dVector::UnitVector((ON_3dVector *)auStack_108,&local_120);
        bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)auStack_108);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->xaxis).z = X.y;
        (__return_storage_ptr__->xaxis).x = (double)auStack_108;
        (__return_storage_ptr__->xaxis).y = X.x;
        ON_CrossProduct((ON_3dVector *)auStack_150,(ON_3dVector *)local_48,
                        (ON_3dVector *)auStack_108);
        (__return_storage_ptr__->yaxis).x = _auStack_150;
        (__return_storage_ptr__->yaxis).y = local_148;
        (__return_storage_ptr__->yaxis).z = local_140;
        return __return_storage_ptr__;
      }
    }
    else {
      uVar4 = (uint)(this->m_grid).m_side_segment_count;
      uVar4 = uVar4 * (uVar4 + 2) >> 1;
      ON_Plane::ON_Plane(__return_storage_ptr__);
      bVar3 = Internal_GetFrameHelper(this,uVar4,uVar4 + 1,__return_storage_ptr__);
      if (bVar3) {
        return __return_storage_ptr__;
      }
      ON_Plane::~ON_Plane(__return_storage_ptr__);
    }
    memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
  }
  else {
    memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::CenterFrame() const
{
  if (false == HasValidPointAndNormalGrid() )
    return ON_Plane::NanPlane;

  if (1 == m_grid.m_side_segment_count)
  {
    const ON_3dPoint P(
      0.25*(m_P[0] + m_P[m_P_stride] + m_P[2 * m_P_stride] + m_P[3 * m_P_stride]),
      0.25*(m_P[1] + m_P[1 + m_P_stride] + m_P[1 + 2 * m_P_stride] + m_P[1 + 3 * m_P_stride]),
      0.25*(m_P[2] + m_P[2 + m_P_stride] + m_P[2 + 2 * m_P_stride] + m_P[2 + 3 * m_P_stride])
    );
    if( false == (P.x == P.x))
      return ON_Plane::NanPlane;
    ON_3dVector N = ON_3dVector(
      (m_N[0] + m_N[m_N_stride] + m_N[2 * m_N_stride] + m_N[3 * m_N_stride]),
      (m_N[1] + m_N[1 + m_N_stride] + m_N[1 + 2 * m_N_stride] + m_N[1 + 3 * m_N_stride]),
      (m_N[2] + m_N[2 + m_N_stride] + m_N[2 + 2 * m_N_stride] + m_N[2 + 3 * m_N_stride])
    ).UnitVector();
    if (false == N.IsUnitVector())
      N = ON_3dVector(m_N).UnitVector();
    if ( N.IsUnitVector() )
    {
      ON_Plane center_frame(P, N);
      const ON_3dPoint Q(
        0.5*(m_P[m_P_stride] + m_P[3 * m_P_stride]),
        0.5*(m_P[1 + m_P_stride] + m_P[1 + 3 * m_P_stride]),
        0.5*(m_P[2 + m_P_stride] + m_P[2 + 3 * m_P_stride])
      );
      const ON_3dVector V = (Q - P).UnitVector();
      const ON_3dVector X = (V - (N*V)*V).UnitVector();
      if (X.IsUnitVector())
      {
        center_frame.xaxis = X;
        center_frame.yaxis = ON_CrossProduct(N, X);
      }
      return center_frame;
    }
  }
  else
  {
    const unsigned int P_dex = (m_grid.m_side_segment_count*(m_grid.m_side_segment_count + 2)) / 2;
    ON_Plane center_frame;
    if (Internal_GetFrameHelper(P_dex, P_dex + 1, center_frame))
      return center_frame;
  }

  return ON_Plane::NanPlane;
}